

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_div_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  _Bool _Var1;
  ggml_tensor *pgVar2;
  
  _Var1 = ggml_can_repeat(b,a);
  if (_Var1) {
    if (inplace) {
      pgVar2 = ggml_view_tensor(ctx,a);
    }
    else {
      pgVar2 = ggml_new_tensor_impl(ctx,a->type,4,a->ne,(ggml_tensor *)0x0,0);
    }
    pgVar2->op = GGML_OP_DIV;
    pgVar2->src[0] = a;
    pgVar2->src[1] = b;
    return pgVar2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x817,"GGML_ASSERT(%s) failed","ggml_can_repeat(b, a)");
}

Assistant:

static struct ggml_tensor * ggml_div_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        bool                  inplace) {
    GGML_ASSERT(ggml_can_repeat(b, a));

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_DIV;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}